

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::NonAnsiPortListSyntax::setChild
          (NonAnsiPortListSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 2) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->closeParen).kind = TVar4.kind;
    (this->closeParen).field_0x2 = TVar4._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->closeParen).rawLen = TVar4.rawLen;
    (this->closeParen).info = TVar4.info;
  }
  else if (index == 1) {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->ports).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->ports).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->ports).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->ports).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->ports).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->ports).elements._M_ptr = (pointer)pSVar3[1].parent;
    (this->ports).elements._M_extent._M_extent_value = (size_t)pSVar1;
  }
  else {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->openParen).kind = TVar4.kind;
    (this->openParen).field_0x2 = TVar4._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->openParen).rawLen = TVar4.rawLen;
    (this->openParen).info = TVar4.info;
  }
  return;
}

Assistant:

void NonAnsiPortListSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: ports = child.node()->as<SeparatedSyntaxList<NonAnsiPortSyntax>>(); return;
        case 2: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}